

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::eagerlyCompile(Compiler *this,uint64_t id,uint eagerness)

{
  kj::_::Mutex::lock(&(this->impl).mutex,0);
  Impl::eagerlyCompile((this->impl).value.ptr,id,eagerness,&this->loader);
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  return;
}

Assistant:

void Compiler::eagerlyCompile(uint64_t id, uint eagerness) const {
  impl.lockExclusive()->get()->eagerlyCompile(id, eagerness, loader);
}